

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetupViewportDrawData(ImGuiViewportP *viewport,ImVector<ImDrawList_*> *draw_lists)

{
  ImGuiIO *pIVar1;
  int *in_RSI;
  long in_RDI;
  int n;
  ImDrawData *draw_data;
  undefined8 local_28;
  int local_1c;
  
  *(undefined1 **)(in_RDI + 0x20) = (undefined1 *)(in_RDI + 0x98);
  *(undefined1 *)(in_RDI + 0x98) = 1;
  if (*in_RSI < 1) {
    local_28 = 0;
  }
  else {
    local_28 = *(undefined8 *)(in_RSI + 2);
  }
  *(undefined8 *)(in_RDI + 0xa0) = local_28;
  *(int *)(in_RDI + 0xa8) = *in_RSI;
  *(undefined4 *)(in_RDI + 0xac) = 0;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb4) = *(undefined8 *)(in_RDI + 8);
  *(undefined8 *)(in_RDI + 0xbc) = *(undefined8 *)(in_RDI + 0x10);
  pIVar1 = ImGui::GetIO();
  *(ImVec2 *)(in_RDI + 0xc4) = pIVar1->DisplayFramebufferScale;
  *(long *)(in_RDI + 0xd0) = in_RDI;
  for (local_1c = 0; local_1c < *in_RSI; local_1c = local_1c + 1) {
    *(int *)(in_RDI + 0xb0) =
         *(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_1c * 8) + 0x20) +
         *(int *)(in_RDI + 0xb0);
    *(int *)(in_RDI + 0xac) =
         *(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_1c * 8) + 0x10) +
         *(int *)(in_RDI + 0xac);
  }
  return;
}

Assistant:

static void SetupViewportDrawData(ImGuiViewportP* viewport, ImVector<ImDrawList*>* draw_lists)
{
    ImDrawData* draw_data = &viewport->DrawDataP;
    viewport->DrawData = draw_data; // Make publicly accessible
    draw_data->Valid = true;
    draw_data->CmdLists = (draw_lists->Size > 0) ? draw_lists->Data : NULL;
    draw_data->CmdListsCount = draw_lists->Size;
    draw_data->TotalVtxCount = draw_data->TotalIdxCount = 0;
    draw_data->DisplayPos = viewport->Pos;
    draw_data->DisplaySize = viewport->Size;
    draw_data->FramebufferScale = ImGui::GetIO().DisplayFramebufferScale; // FIXME-VIEWPORT: This may vary on a per-monitor/viewport basis?
    draw_data->OwnerViewport = viewport;
    for (int n = 0; n < draw_lists->Size; n++)
    {
        draw_data->TotalVtxCount += draw_lists->Data[n]->VtxBuffer.Size;
        draw_data->TotalIdxCount += draw_lists->Data[n]->IdxBuffer.Size;
    }
}